

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void c4::afree(void *ptr)

{
  if (detail::s_afree == (undefined *)0x0) {
    afree();
  }
  (*(code *)detail::s_afree)(ptr);
  return;
}

Assistant:

void afree(void* ptr)
{
    C4_ASSERT_MSG(c4::get_afree() != nullptr, "did you forget to call set_afree()?");
    auto fn = c4::get_afree();
    fn(ptr);
}